

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

void duckdb::Prefix::New(ART *art,reference<Node> *ref,ARTKey *key,idx_t depth,idx_t count)

{
  Node *node;
  ulong uVar1;
  long lVar2;
  Prefix prefix;
  Prefix local_48;
  
  if (count != 0) {
    lVar2 = 0;
    node = ref->_M_data;
    do {
      uVar1 = (ulong)art->prefix_count;
      if (count <= art->prefix_count) {
        uVar1 = count;
      }
      NewInternal(&local_48,art,node,key->data,(uint8_t)uVar1,lVar2 + depth,PREFIX);
      ref->_M_data = local_48.ptr;
      lVar2 = lVar2 + uVar1;
      count = count - uVar1;
      node = local_48.ptr;
    } while (count != 0);
  }
  return;
}

Assistant:

void Prefix::New(ART &art, reference<Node> &ref, const ARTKey &key, const idx_t depth, idx_t count) {
	idx_t offset = 0;

	while (count) {
		auto min = MinValue(UnsafeNumericCast<idx_t>(Count(art)), count);
		auto this_count = UnsafeNumericCast<uint8_t>(min);
		auto prefix = NewInternal(art, ref, key.data, this_count, offset + depth, PREFIX);

		ref = *prefix.ptr;
		offset += this_count;
		count -= this_count;
	}
}